

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.h
# Opt level: O3

void __thiscall leveldb::SnapshotList::Delete(SnapshotList *this,SnapshotImpl *snapshot)

{
  SnapshotImpl *pSVar1;
  SnapshotImpl *pSVar2;
  
  if (snapshot->list_ == this) {
    pSVar1 = snapshot->prev_;
    pSVar2 = snapshot->next_;
    pSVar1->next_ = pSVar2;
    pSVar2->prev_ = pSVar1;
    (*(snapshot->super_Snapshot)._vptr_Snapshot[1])(snapshot);
    return;
  }
  __assert_fail("snapshot->list_ == this",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./db/snapshot.h"
                ,0x51,"void leveldb::SnapshotList::Delete(const SnapshotImpl *)");
}

Assistant:

void Delete(const SnapshotImpl* snapshot) {
#if !defined(NDEBUG)
    assert(snapshot->list_ == this);
#endif  // !defined(NDEBUG)
    snapshot->prev_->next_ = snapshot->next_;
    snapshot->next_->prev_ = snapshot->prev_;
    delete snapshot;
  }